

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_thread.c
# Opt level: O2

void nhr_mutex_lock(nhr_mutex mutex)

{
  if (mutex == (nhr_mutex)0x0) {
    return;
  }
  pthread_mutex_lock((pthread_mutex_t *)mutex);
  return;
}

Assistant:

void nhr_mutex_lock(nhr_mutex mutex) {
	if (mutex)  {
#if defined(NHR_OS_WINDOWS)
		EnterCriticalSection((LPCRITICAL_SECTION)mutex);
#else
		pthread_mutex_lock((pthread_mutex_t *)mutex);
#endif
	}
}